

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::InitBoxedInlineSegments<Js::JavascriptNativeIntArray>
          (JavascriptArray *this,JavascriptNativeIntArray *instance,bool deepCopy)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 size;
  InterruptPoller *pIVar3;
  SparseArraySegmentBase *pSVar4;
  code *pcVar5;
  bool bVar6;
  DynamicObjectFlags DVar7;
  SparseArraySegmentBase *pSVar8;
  undefined4 *puVar9;
  Recycler *pRVar10;
  SparseArraySegmentBase *pSVar11;
  Type TVar12;
  Type *addr;
  undefined1 local_68 [8];
  AutoDisableInterrupt failFastError;
  
  DVar7 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  DynamicObject::SetArrayFlags((DynamicObject *)this,DVar7 & ~HasSegmentMap);
  pSVar11 = (instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  TVar12 = pSVar11->size;
  bVar6 = IsInlineSegment(pSVar11,(JavascriptArray *)instance);
  if (bVar6) {
    pSVar8 = &DetermineInlineHeadSegmentPointer<Js::JavascriptNativeIntArray,0u,true>
                        ((JavascriptNativeIntArray *)this)->super_SparseArraySegmentBase;
    ((SparseArraySegmentBase *)&pSVar8->left)->left = pSVar11->left;
    pSVar8->length = pSVar11->length;
    TVar12 = 0x40;
    if (pSVar11->size < 0x40) {
      TVar12 = pSVar11->size;
    }
    pSVar8->size = TVar12;
  }
  else {
    pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)this);
    failFastError._8_4_ = pSVar11->left;
    uVar1 = pSVar11->length;
    uVar2 = pSVar11->size;
    pSVar8 = (pSVar11->next).ptr;
    bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayLeafSegmentPhase);
    if ((pSVar8 != (SparseArraySegmentBase *)0x0) || (bVar6)) {
      pSVar8 = &SparseArraySegment<int>::AllocateSegmentImpl<false>
                          (pRVar10,failFastError._8_4_,uVar1,uVar2,pSVar8)->
                super_SparseArraySegmentBase;
    }
    else {
      pSVar8 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                          (pRVar10,failFastError._8_4_,uVar1,uVar2,(SparseArraySegmentBase *)0x0)->
                super_SparseArraySegmentBase;
    }
  }
  SetHeadAndLastUsedSegment(this,pSVar8);
  SparseArraySegmentBase::CheckLengthvsSize(pSVar8);
  bVar6 = IsInlineSegment(pSVar11,(JavascriptArray *)instance);
  if ((bVar6) && (bVar6 = IsInlineSegment(pSVar8,this), !bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f06,
                                "(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)))"
                                ,
                                "!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this))"
                               );
    if (!bVar6) goto LAB_00bad8be;
    *puVar9 = 0;
  }
  Memory::CopyArray<int,int,Memory::Recycler>
            ((int *)(pSVar8 + 1),(ulong)pSVar8->size,(int *)(pSVar11 + 1),(ulong)TVar12);
  if (deepCopy) {
    local_68 = (undefined1  [8])
               ((((((this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext;
    failFastError.m_threadContext._0_2_ = 0;
    failFastError.m_threadContext._2_1_ = 1;
    pIVar3 = ((ThreadContext *)local_68)->interruptPoller;
    if (pIVar3 != (InterruptPoller *)0x0) {
      failFastError.m_threadContext._0_2_ = (ushort)pIVar3->isDisabled << 8;
      pIVar3->isDisabled = true;
    }
    failFastError._8_8_ = &DAT_015bbe90;
    do {
      pSVar4 = (pSVar11->next).ptr;
      if (pSVar4 == (SparseArraySegmentBase *)0x0) {
        (pSVar8->next).ptr = (SparseArraySegmentBase *)0x0;
        pSVar8 = (SparseArraySegmentBase *)0x0;
      }
      else {
        pRVar10 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        uVar1 = pSVar4->left;
        uVar2 = pSVar4->length;
        size = pSVar4->size;
        pSVar11 = (pSVar4->next).ptr;
        bVar6 = Phases::IsEnabled((Phases *)failFastError._8_8_,NativeArrayLeafSegmentPhase);
        if (pSVar11 == (SparseArraySegmentBase *)0x0 && !bVar6) {
          pSVar11 = &SparseArraySegment<int>::AllocateSegmentImpl<true>
                               (pRVar10,uVar1,uVar2,size,(SparseArraySegmentBase *)0x0)->
                     super_SparseArraySegmentBase;
        }
        else {
          pSVar11 = &SparseArraySegment<int>::AllocateSegmentImpl<false>
                               (pRVar10,uVar1,uVar2,size,pSVar11)->super_SparseArraySegmentBase;
        }
        addr = &pSVar8->next;
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = pSVar11;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        pSVar8 = addr->ptr;
        Memory::CopyArray<int,int,Memory::Recycler>
                  ((int *)(pSVar8 + 1),(ulong)pSVar8->size,(int *)(pSVar4 + 1),(ulong)pSVar4->size);
        pSVar11 = pSVar4;
      }
    } while (pSVar8 != (SparseArraySegmentBase *)0x0);
    failFastError.m_threadContext._0_1_ = 1;
    AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_68);
  }
  else {
    pSVar4 = (pSVar11->next).ptr;
    Memory::Recycler::WBSetBit((char *)&pSVar8->next);
    (pSVar8->next).ptr = pSVar4;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pSVar8->next);
  }
  pSVar8 = (((this->head).ptr)->next).ptr;
  if ((pSVar8 != (SparseArraySegmentBase *)0x0) && (deepCopy && pSVar8 == (pSVar11->next).ptr)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f2f,
                                "(this->head->next == nullptr || this->head->next != src->next || !deepCopy)"
                                ,
                                "this->head->next == nullptr || this->head->next != src->next || !deepCopy"
                               );
    if (!bVar6) {
LAB_00bad8be:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

void JavascriptArray::InitBoxedInlineSegments(T * instance, bool deepCopy)
    {
        // Don't copy the segment map, we will build it again
        SetFlags(GetFlags() & ~DynamicObjectFlags::HasSegmentMap);

        SparseArraySegment<typename T::TElement>* src = SparseArraySegment<typename T::TElement>::From(instance->head);
        SparseArraySegment<typename T::TElement>* dst;

        uint32 sourceSize = src->size;
        if (IsInlineSegment(src, instance))
        {
            // Copy head segment data between inlined head segments
            dst = DetermineInlineHeadSegmentPointer<T, 0, true>(static_cast<T*>(this));
            dst->left = src->left;
            dst->length = src->length;
            uint inlineChunkSize = SparseArraySegmentBase::INLINE_CHUNK_SIZE;
            dst->size = min(src->size, inlineChunkSize);
            sourceSize = dst->size;
        }
        else
        {
            // Otherwise, ensure that the new head segment is allocated now in the recycler so that the data can be copied.
            // Note: src->next is provided to control whether a leaf segment is allocated just as it is with instance. If
            //  src->next is non-null, the appropriate update to dst->next will continue below.
            dst = SparseArraySegment<typename T::TElement>::AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
        }

        SetHeadAndLastUsedSegment(dst);
        dst->CheckLengthvsSize();

        Assert(!IsInlineSegment(src, instance) || IsInlineSegment(dst, static_cast<T*>(this)));

        CopyArray(dst->elements, dst->size, src->elements, sourceSize);

        if (!deepCopy)
        {
            // Without a deep copy, point to the existing next segment from the original instance
            dst->next = src->next;
        }
        else
        {
            // When deepCopy is true, make a separate copy of each segment. While this involves data
            // duplication, it allows the new object to have a separate lifetime without sharing data.
            AutoDisableInterrupt failFastError(GetScriptContext()->GetThreadContext());
            do
            {
                if (src->next != nullptr)
                {
                    // Allocate a new segment in the destination and copy from src
                    // note: PointerValue is to strip SWB wrapping before static_cast
                    src = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(src->next));

                    dst->next = dst->AllocateSegment(GetRecycler(), src->left, src->length, src->size, src->next);
                    dst = static_cast<SparseArraySegment<typename T::TElement>*>(PointerValue(dst->next));

                    CopyArray(dst->elements, dst->size, src->elements, src->size);
                }
                else
                {
                    // Terminate the loop
                    dst->next = nullptr;
                    dst = nullptr;
                }
            } while (dst != nullptr);
            failFastError.Completed();
        }

        // Assert either
        // - there is only the head segment
        // - the new head segment points to a new next segment
        // - the new head segment points to the existing next segment because this is not a deepCopy
        Assert(this->head->next == nullptr || this->head->next != src->next || !deepCopy);
    }